

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O0

void __thiscall llvm::Triple::setEnvironmentName(Triple *this,StringRef Str)

{
  Twine local_158;
  Twine local_140;
  StringRef local_128;
  Twine local_118;
  Twine local_100;
  StringRef local_e8;
  Twine local_d8;
  StringRef local_c0;
  Twine local_b0;
  Twine local_98;
  Twine local_80;
  Twine local_68;
  Twine local_50;
  Twine local_38;
  Triple *local_20;
  Triple *this_local;
  StringRef Str_local;
  
  Str_local.Data = (char *)Str.Length;
  this_local = (Triple *)Str.Data;
  local_20 = this;
  local_c0 = getArchName(this);
  llvm::operator+(&local_b0,&local_c0,"-");
  local_e8 = getVendorName(this);
  Twine::Twine(&local_d8,&local_e8);
  llvm::operator+(&local_98,&local_b0,&local_d8);
  Twine::Twine(&local_100,"-");
  llvm::operator+(&local_80,&local_98,&local_100);
  local_128 = getOSName(this);
  Twine::Twine(&local_118,&local_128);
  llvm::operator+(&local_68,&local_80,&local_118);
  Twine::Twine(&local_140,"-");
  llvm::operator+(&local_50,&local_68,&local_140);
  Twine::Twine(&local_158,(StringRef *)&this_local);
  llvm::operator+(&local_38,&local_50,&local_158);
  setTriple(this,&local_38);
  return;
}

Assistant:

void Triple::setEnvironmentName(StringRef Str) {
  setTriple(getArchName() + "-" + getVendorName() + "-" + getOSName() +
            "-" + Str);
}